

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilTests.cpp
# Opt level: O0

void deqp::gles2::Functional::DepthStencilCaseUtil::generateStencilVisualizeCommands
               (TestRenderTarget *target,
               vector<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
               *commands)

{
  Vector<bool,_4> local_104;
  Vector<float,_4> local_100;
  undefined1 local_f0 [16];
  undefined1 local_e0 [8];
  RenderCommand cmd;
  int ndx;
  int stencilValues [16];
  float colorStep;
  int numValues;
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
  *commands_local;
  TestRenderTarget *target_local;
  
  getStencilTestValues(target->stencilBits,0x10,(int *)&cmd.colorMask);
  for (cmd.color.m_data[3] = 0.0; (int)cmd.color.m_data[3] < 0x10;
      cmd.color.m_data[3] = (float)((int)cmd.color.m_data[3] + 1)) {
    RenderCommand::RenderCommand((RenderCommand *)local_e0);
    local_e0._0_4_ = FACETYPE_FRONT;
    rr::WindowRectangle::WindowRectangle
              ((WindowRectangle *)local_f0,0,0,target->width,target->height);
    cmd.params.depth = (float)local_f0._0_4_;
    cmd.params.depthWriteMask = (bool)local_f0[4];
    cmd.params._77_3_ = local_f0._5_3_;
    cmd.rect.left = local_f0._8_4_;
    cmd.rect.bottom = local_f0._12_4_;
    tcu::Vector<float,_4>::Vector
              (&local_100,0.0,(float)((int)cmd.color.m_data[3] + 1) * 0.0625,0.0,0.0);
    cmd.rect.width = (int)local_100.m_data[0];
    cmd.rect.height = (int)local_100.m_data[1];
    cmd.color.m_data[0] = local_100.m_data[2];
    cmd.color.m_data[1] = local_100.m_data[3];
    tcu::Vector<bool,_4>::Vector(&local_104,false,true,false,false);
    cmd.color.m_data[2] = (float)local_104.m_data;
    local_e0[4] = true;
    cmd.params.visibleFace = 0x202;
    cmd.params._4_4_ = *(undefined4 *)(&cmd.colorMask)[(int)cmd.color.m_data[3]].m_data;
    cmd.params.stencil[0].function = 0xffffffff;
    cmd.params.stencil[0].reference = 0x1e00;
    cmd.params.stencil[0].compareMask = 0x1e00;
    cmd.params.stencil[0].stencilFailOp = 0x1e00;
    cmd.params.stencil[0].depthFailOp = 0;
    cmd.params.stencil[0].writeMask = cmd.params._4_4_;
    cmd.params.stencil[0].depthPassOp = 0x202;
    cmd.params.stencil[1].function = 0xffffffff;
    cmd.params.stencil[1].reference = 0x1e00;
    cmd.params.stencil[1].compareMask = 0x1e00;
    cmd.params.stencil[1].stencilFailOp = 0x1e00;
    cmd.params.stencil[1].depthFailOp = 0;
    std::
    vector<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
    ::push_back(commands,(value_type *)local_e0);
  }
  return;
}

Assistant:

void generateStencilVisualizeCommands (const TestRenderTarget& target, vector<RenderCommand>& commands)
{
	const int	numValues		= 4*4;
	float		colorStep		= 1.0f / numValues; // 0 is reserved for non-matching.
	int			stencilValues[numValues];

	getStencilTestValues(target.stencilBits, numValues, &stencilValues[0]);

	for (int ndx = 0; ndx < numValues; ndx++)
	{
		RenderCommand cmd;

		cmd.params.visibleFace							= rr::FACETYPE_FRONT;
		cmd.rect										= rr::WindowRectangle(0, 0, target.width, target.height);
		cmd.color										= Vec4(0.0f, colorStep*float(ndx+1), 0.0f, 0.0f);
		cmd.colorMask									= tcu::BVec4(false, true, false, false);
		cmd.params.stencilTestEnabled					= true;

		cmd.params.stencil[rr::FACETYPE_FRONT].function			= GL_EQUAL;
		cmd.params.stencil[rr::FACETYPE_FRONT].reference		= stencilValues[ndx];
		cmd.params.stencil[rr::FACETYPE_FRONT].compareMask		= ~0u;
		cmd.params.stencil[rr::FACETYPE_FRONT].stencilFailOp	= GL_KEEP;
		cmd.params.stencil[rr::FACETYPE_FRONT].depthFailOp		= GL_KEEP;
		cmd.params.stencil[rr::FACETYPE_FRONT].depthPassOp		= GL_KEEP;
		cmd.params.stencil[rr::FACETYPE_FRONT].writeMask		= 0u;

		cmd.params.stencil[rr::FACETYPE_BACK] = cmd.params.stencil[rr::FACETYPE_FRONT];

		commands.push_back(cmd);
	}
}